

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O1

void __thiscall xLearn::MODEL_TEST_Init_fm_Test::TestBody(MODEL_TEST_Init_fm_Test *this)

{
  real_t *prVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 in_XMM2 [16];
  AssertionResult gtest_ar;
  index_t param_num_v;
  index_t param_num_w;
  Model model_fm;
  HyperParam hyper_param;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  AssertHelper local_328;
  internal local_320 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  uint local_30c;
  ulong local_308;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  real_t *local_2f0;
  real_t *local_2e8;
  long local_2e0;
  ulong local_2d8;
  Model local_2d0;
  HyperParam local_240;
  
  Init();
  std::__cxx11::string::_M_replace
            ((ulong)&local_240.score_func,0,(char *)local_240.score_func._M_string_length,0x14160e);
  local_2d0.score_func_._M_dataplus._M_p = (pointer)&local_2d0.score_func_.field_2;
  local_2d0.score_func_._M_string_length = 0;
  local_2d0.score_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.loss_func_._M_dataplus._M_p = (pointer)&local_2d0.loss_func_.field_2;
  local_2d0.loss_func_._M_string_length = 0;
  local_2d0.loss_func_.field_2._M_local_buf[0] = '\0';
  local_2d0.param_w_ = (real_t *)0x0;
  local_2d0.param_v_ = (real_t *)0x0;
  local_2d0.param_b_ = (float *)0x0;
  local_2d0.param_best_w_ = (real_t *)0x0;
  local_2d0.param_best_v_ = (real_t *)0x0;
  local_2d0.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&local_2d0,&local_240.score_func,&local_240.loss_func,local_240.num_feature,
                    local_240.num_field,local_240.num_K,local_240.auxiliary_size,0.5);
  prVar1 = local_2d0.param_b_;
  local_2f0 = local_2d0.param_w_;
  local_2f4 = local_240.num_feature * 2;
  local_2e8 = local_2d0.param_v_;
  local_30c = local_2f4 * local_240.num_K;
  local_330.ptr_._0_4_ = local_2d0.param_num_w_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_320,"param_num_w","model_fm.GetNumParameter_w()",&local_2f4,(uint *)&local_330);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_330);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (local_330.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_330.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_330.ptr_ + 8))();
      }
      local_330.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_330.ptr_._0_4_ = local_2d0.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_320,"param_num_v","model_fm.GetNumParameter_v()",&local_30c,(uint *)&local_330);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_330);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,100,pcVar5);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (local_330.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_330.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_330.ptr_ + 8))();
      }
      local_330.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_330.ptr_._0_4_ = local_30c + 2 + local_2f4;
  local_328.data_._0_4_ = local_2d0.param_num_w_ + 2 + local_2d0.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_320,"param_num_v+param_num_w+2","model_fm.GetNumParameter()",(uint *)&local_330,
             (uint *)&local_328);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_330);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x65,pcVar5);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (local_330.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_330.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_330.ptr_ + 8))();
      }
      local_330.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>(local_320,"b[0]","0",*prVar1,0.0);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_330);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x66,pcVar5);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (local_330.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_330.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_330.ptr_ + 8))();
      }
      local_330.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperFloatingPointEQ<float>(local_320,"b[1]","1.0",prVar1[1],1.0);
  if (local_320[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_330);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x67,pcVar5);
    testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    if (local_330.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_330.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_330.ptr_ + 8))();
      }
      local_330.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_308 = (ulong)local_240.auxiliary_size;
  local_2fc = local_2d0.param_num_w_;
  if (local_2d0.param_num_w_ != 0) {
    local_2e0 = local_308 - 1;
    uVar7 = 0;
    uVar4 = 1;
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_320,"w[i]","0.0",local_2f0[uVar7],0.0);
      if (local_320[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_330);
        pcVar5 = "";
        if (local_318.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_328,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x6b,pcVar5);
        testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
        testing::internal::AssertHelper::~AssertHelper(&local_328);
        if (local_330.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_330.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_330.ptr_ + 8))();
          }
          local_330.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      local_2d8 = uVar7;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar8 = local_2e0;
      local_2f8 = uVar4;
      if (1 < (uint)local_308) {
        do {
          testing::internal::CmpHelperFloatingPointEQ<float>
                    (local_320,"w[i+j]","1.0",local_2f0[uVar4],1.0);
          if (local_320[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_330);
            pcVar5 = "";
            if (local_318.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_328,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
                       ,0x6d,pcVar5);
            testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
            testing::internal::AssertHelper::~AssertHelper(&local_328);
            if (local_330.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) &&
                 (local_330.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_330.ptr_ + 8))();
              }
              local_330.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_318,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar4 = uVar4 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      uVar6 = (int)local_2d8 + (int)local_308;
      uVar7 = (ulong)uVar6;
      uVar4 = local_2f8 + (int)local_308;
    } while (uVar6 < local_2fc);
  }
  auVar9 = vcvtusi2ss_avx512f(in_XMM2,local_2d0.num_K_);
  auVar9 = ZEXT416((uint)(auVar9._0_4_ * 0.25));
  auVar9 = vroundss_avx(auVar9,auVar9,10);
  iVar3 = vcvttss2usi_avx512f(auVar9);
  uVar4 = iVar3 * 4;
  if (uVar4 < local_30c) {
    local_308 = (ulong)((int)local_308 * uVar4);
    do {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_320,"v[i]","1.0",local_2e8[uVar4],1.0);
      if (local_320[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_330);
        pcVar5 = "";
        if (local_318.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_328,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x72,pcVar5);
        testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_330);
        testing::internal::AssertHelper::~AssertHelper(&local_328);
        if (local_330.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_330.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_330.ptr_ + 8))();
          }
          local_330.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar4 = uVar4 + (uint)local_308;
    } while (uVar4 < local_30c);
  }
  Model::~Model(&local_2d0);
  HyperParam::~HyperParam(&local_240);
  return;
}

Assistant:

TEST(MODEL_TEST, Init_fm) {
  HyperParam hyper_param = Init();
  hyper_param.score_func = "fm";
  Model model_fm;
  model_fm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 
                    hyper_param.auxiliary_size, 
                    0.5);
  real_t* b = model_fm.GetParameter_b();
  real_t* w = model_fm.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_fm.GetParameter_v();
  index_t param_num_v = hyper_param.num_feature *
                        hyper_param.num_K * 2;
  EXPECT_EQ(param_num_w, model_fm.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_fm.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_fm.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t len = model_fm.GetNumParameter_w();
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < len; i+=aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }
  }
  index_t k_aligned = model_fm.get_aligned_k();
  for (index_t i = k_aligned; i < param_num_v; i+=(aux_size*k_aligned)) {
    EXPECT_FLOAT_EQ(v[i], 1.0);
  }
}